

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

WebPEncodingError
VP8LGetBackwardReferences
          (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
          int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
          int *cache_bits_best)

{
  VP8LBackwardRefs *pVVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  PixOrCopyBlock **ppPVar6;
  PixOrCopyBlock **ppPVar7;
  long *plVar8;
  long lVar9;
  double dVar10;
  PixOrCopyBlock *pPVar11;
  PixOrCopyBlock **ppPVar12;
  PixOrCopyBlock *pPVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  VP8LBackwardRefs *refs_00;
  ulong uVar20;
  uint32_t *puVar21;
  void *ptr;
  short *psVar22;
  long **pplVar23;
  VP8LHistogram *pVVar24;
  long lVar25;
  uint uVar26;
  PixOrCopyBlock **ppPVar27;
  long *plVar28;
  short sVar29;
  uint uVar30;
  VP8LBackwardRefs *pVVar31;
  uint *puVar32;
  PixOrCopy *pPVar33;
  VP8LBackwardRefs *pVVar34;
  ulong uVar35;
  VP8LColorCache *pVVar36;
  PixOrCopyBlock *pPVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  PixOrCopy v;
  ulong uVar41;
  VP8LBackwardRefs *pVVar42;
  uint uVar43;
  VP8LHashChain *hash_chain_00;
  undefined4 in_register_0000008c;
  VP8LBackwardRefs *pVVar44;
  uint uVar45;
  uint uVar46;
  long lVar47;
  int *piVar48;
  ulong uVar49;
  long lVar50;
  PixOrCopy *pPVar51;
  uint uVar52;
  bool bVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  int lz77_types_best [2];
  double bit_costs_best [2];
  int window_offsets [32];
  int cc_init [11];
  PixOrCopy *local_278;
  uint local_240;
  uint local_238 [4];
  VP8LHashChain local_228;
  VP8LHistogram *local_210;
  uint local_204;
  uint64_t local_200;
  VP8LBackwardRefs *local_1f8;
  PixOrCopyBlock **local_1f0;
  long local_1e8;
  long *local_1e0;
  double local_1d8 [3];
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  PixOrCopyBlock *pPStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  PixOrCopyBlock *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  long *local_e8 [16];
  int local_68 [14];
  
  pVVar44 = (VP8LBackwardRefs *)CONCAT44(in_register_0000008c,lz77_types_to_try);
  if (low_effort == 0) {
    local_238[0] = 0;
    local_238[1] = 0;
    local_1d8[0] = 1.79769313486232e+308;
    local_1d8[1] = 1.79769313486232e+308;
    local_1a0 = refs + 1;
    refs_00 = refs + 2;
    if (do_no_cache == 0) {
      refs_00 = local_1a0;
    }
    local_228.offset_length_ = (uint32_t *)0x0;
    local_228._8_8_ = 0;
    local_210 = VP8LAllocateHistogram(10);
    if (local_210 == (VP8LHistogram *)0x0) {
LAB_0014000a:
      WebPSafeFree(local_228.offset_length_);
      local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
      local_228.offset_length_ = (uint32_t *)0x0;
      VP8LFreeHistogram(local_210);
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    if (lz77_types_to_try == 0) {
      local_240 = 0;
      uVar52 = 0;
    }
    else {
      uVar26 = height * width;
      local_200 = (uint64_t)(int)uVar26;
      uVar38 = uVar26 - 2;
      ppPVar27 = &refs_00->refs_;
      local_1e8 = -(long)width;
      local_1a8 = (ulong)(uint)width << 0x20;
      local_1f0 = &refs->refs_;
      uVar52 = cache_bits_max;
      if (quality < 0x1a) {
        uVar52 = 0;
      }
      uVar20 = (ulong)(uVar52 + 1);
      local_238[3] = 0x20 - uVar52;
      local_1b8 = (ulong)uVar38 + 1;
      local_1b0 = (long)(int)uVar38;
      local_1c0 = (long)(int)uVar38 * 2 + 2;
      local_1e0 = (long *)(local_198 + (ulong)uVar52 * 0x10);
      pVVar1 = (VP8LBackwardRefs *)((ulong)uVar52 + 1);
      uVar38 = 1;
      do {
        local_204 = lz77_types_to_try;
        if ((uVar38 & lz77_types_to_try) != 0) {
          iVar14 = (int)hash_chain;
          if (uVar38 == 1) {
LAB_0013f687:
            uVar18 = BackwardReferencesLz77
                               (width,height,argb,iVar14,(VP8LHashChain *)refs_00,pVVar44);
          }
          else if (uVar38 == 4) {
            puVar21 = (uint32_t *)WebPSafeMalloc(local_200,4);
            local_228.offset_length_ = puVar21;
            if (puVar21 == (uint32_t *)0x0) goto LAB_0014000a;
            local_228.size_ = (int)local_200;
            local_128 = 0;
            uStack_120 = 0;
            local_138 = 0;
            uStack_130 = 0;
            local_148 = 0;
            uStack_140 = 0;
            local_158 = 0;
            uStack_150 = 0;
            local_168 = 0;
            uStack_160 = 0;
            local_178 = (PixOrCopyBlock *)0x0;
            uStack_170 = 0;
            local_188 = (PixOrCopyBlock **)0x0;
            uStack_180 = (PixOrCopyBlock *)0x0;
            local_198 = (undefined1  [8])0x0;
            pPStack_190 = (PixOrCopyBlock *)0x0;
            local_e8[0xe] = (long *)0x0;
            local_e8[0xf] = (long *)0x0;
            local_e8[0xc] = (long *)0x0;
            local_e8[0xd] = (long *)0x0;
            local_e8[10] = (long *)0x0;
            local_e8[0xb] = (long *)0x0;
            local_e8[8] = (long *)0x0;
            local_e8[9] = (long *)0x0;
            local_e8[6] = (long *)0x0;
            local_e8[7] = (long *)0x0;
            local_e8[4] = (long *)0x0;
            local_e8[5] = (long *)0x0;
            local_e8[2] = (long *)0x0;
            local_e8[3] = (long *)0x0;
            local_e8[0] = (long *)0x0;
            local_e8[1] = (long *)0x0;
            ptr = WebPSafeMalloc(local_200,2);
            if (ptr != (void *)0x0) {
              *(undefined2 *)((long)ptr + local_1b0 * 2 + 2) = 1;
              if (1 < (int)uVar26) {
                psVar22 = (short *)((long)ptr + local_1c0);
                lVar47 = local_1b8;
                do {
                  sVar29 = 1;
                  if (argb[lVar47 + -1] == argb[lVar47]) {
                    sVar29 = (ushort)(*psVar22 != 0xfff) + *psVar22;
                  }
                  psVar22[-1] = sVar29;
                  psVar22 = psVar22 + -1;
                  lVar50 = lVar47 + -1;
                  bVar53 = 0 < lVar47;
                  lVar47 = lVar50;
                } while (lVar50 != 0 && bVar53);
              }
              iVar19 = 0;
              iVar14 = 0;
              do {
                iVar16 = -6;
                do {
                  iVar15 = iVar19 + iVar16;
                  if ((0 < iVar15) &&
                     (iVar17 = VP8LDistanceToPlaneCode(width,iVar15), iVar17 < 0x21)) {
                    *(int *)((long)&local_1a0 + (long)iVar17 * 4 + 4) = iVar15;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 != 7);
                iVar14 = iVar14 + 1;
                iVar19 = iVar19 + width;
              } while (iVar14 != 7);
              lVar47 = 0;
              pVVar44 = (VP8LBackwardRefs *)0x0;
              do {
                if (*(int *)(local_198 + lVar47 * 4) != 0) {
                  iVar14 = (int)pVVar44;
                  pVVar44 = (VP8LBackwardRefs *)(ulong)(iVar14 + 1);
                  *(int *)(local_198 + (long)iVar14 * 4) = *(int *)(local_198 + lVar47 * 4);
                }
                lVar47 = lVar47 + 1;
              } while (lVar47 != 0x20);
              if ((int)pVVar44 < 1) {
                pVVar34 = (VP8LBackwardRefs *)0x0;
              }
              else {
                pVVar31 = (VP8LBackwardRefs *)0x0;
                pVVar34 = (VP8LBackwardRefs *)0x0;
                do {
                  iVar14 = *(int *)(local_198 + (long)pVVar31 * 4);
                  pVVar42 = (VP8LBackwardRefs *)0x1;
                  do {
                    iVar19 = *(int *)((long)&local_1a0 + (long)pVVar42 * 4 + 4) + 1;
                    if (pVVar44 <= pVVar42) break;
                    pVVar42 = (VP8LBackwardRefs *)((long)&pVVar42->block_size_ + 1);
                  } while (iVar14 != iVar19);
                  if (iVar14 != iVar19) {
                    *(int *)((long)local_e8 + (long)(int)pVVar34 * 4) = iVar14;
                    pVVar34 = (VP8LBackwardRefs *)(ulong)((int)pVVar34 + 1);
                  }
                  pVVar31 = (VP8LBackwardRefs *)((long)&pVVar31->block_size_ + 1);
                } while (pVVar31 != pVVar44);
              }
              *puVar21 = 0;
              if (1 < (int)uVar26) {
                puVar5 = hash_chain->offset_length_;
                uVar18 = 0xffffffff;
                uVar49 = 1;
                uVar40 = 0xffffffff;
                do {
                  if (((~puVar5[uVar49] & 0xfff) == 0) && (0 < (int)pVVar44)) {
                    uVar43 = puVar5[uVar49] >> 0xc;
                    pVVar31 = (VP8LBackwardRefs *)0x0;
                    do {
                      if (uVar43 == *(uint *)(local_198 + (long)pVVar31 * 4)) {
                        uVar45 = 0xfff;
                        goto LAB_0013f636;
                      }
                      pVVar31 = (VP8LBackwardRefs *)((long)&pVVar31->block_size_ + 1);
                    } while (pVVar44 != pVVar31);
                  }
                  uVar46 = uVar40 - 2;
                  pVVar31 = pVVar44;
                  if (uVar46 < 0xffd) {
                    pVVar31 = pVVar34;
                  }
                  uVar45 = uVar40 - 1;
                  if (uVar46 >= 0xffd) {
                    uVar18 = 0;
                    uVar45 = 0;
                  }
                  uVar43 = uVar18;
                  if (0 < (int)pVVar31) {
                    pVVar42 = (VP8LBackwardRefs *)0x0;
                    do {
                      pplVar23 = (long **)local_198;
                      if (uVar46 < 0xffd) {
                        pplVar23 = local_e8;
                      }
                      uVar43 = *(uint *)((long)pplVar23 + (long)pVVar42 * 4);
                      uVar40 = (int)uVar49 - uVar43;
                      uVar35 = (ulong)uVar40;
                      if ((-1 < (int)uVar40) && (argb[uVar40] == argb[uVar49])) {
                        uVar40 = 0;
                        uVar41 = uVar49 & 0xffffffff;
                        while( true ) {
                          uVar3 = *(ushort *)((long)ptr + uVar35 * 2);
                          uVar2 = *(ushort *)((long)ptr + uVar41 * 2);
                          uVar30 = (uint)uVar3;
                          if (uVar3 != uVar2) break;
                          uVar40 = uVar40 + uVar30;
                          if (((0xfff < uVar40) ||
                              (uVar39 = (int)uVar41 + uVar30, uVar41 = (ulong)uVar39,
                              (int)uVar26 <= (int)uVar39)) ||
                             (uVar35 = (ulong)((int)uVar35 + uVar30), argb[uVar35] != argb[uVar41]))
                          goto LAB_0013f5c2;
                        }
                        if (uVar2 <= uVar3) {
                          uVar30 = (uint)uVar2;
                        }
                        uVar40 = uVar40 + uVar30;
LAB_0013f5c2:
                        if (((int)uVar45 < (int)uVar40) &&
                           (uVar45 = uVar40, uVar18 = uVar43, 0xffe < uVar40)) {
                          uVar45 = 0xfff;
                          goto LAB_0013f636;
                        }
                      }
                      uVar43 = uVar18;
                      pVVar42 = (VP8LBackwardRefs *)((long)&pVVar42->block_size_ + 1);
                      uVar18 = uVar43;
                    } while (pVVar42 != pVVar31);
                  }
                  uVar46 = 0;
                  uVar40 = 0;
                  uVar18 = 0;
                  if (4 < (int)uVar45) {
LAB_0013f636:
                    uVar46 = uVar43 << 0xc | uVar45;
                    uVar18 = uVar43;
                    uVar40 = uVar45;
                  }
                  puVar21[uVar49] = uVar46;
                  uVar49 = uVar49 + 1;
                  local_1f8 = pVVar34;
                } while (uVar49 != uVar26);
              }
              *puVar21 = 0;
              WebPSafeFree(ptr);
              iVar14 = (int)&local_228;
              goto LAB_0013f687;
            }
            uVar18 = 0;
          }
          else {
            if (uVar38 != 2) goto LAB_0014000a;
            if (refs_00->tail_ != (PixOrCopyBlock **)0x0) {
              *refs_00->tail_ = refs_00->free_blocks_;
            }
            refs_00->free_blocks_ = refs_00->refs_;
            refs_00->tail_ = ppPVar27;
            refs_00->last_block_ = (PixOrCopyBlock *)0x0;
            refs_00->refs_ = (PixOrCopyBlock *)0x0;
            VP8LBackwardRefsCursorAdd(refs_00,(PixOrCopy)((ulong)*argb << 0x20 | 0x10000));
            if (1 < (int)uVar26) {
              uVar49 = 1;
              do {
                iVar19 = (int)uVar49;
                iVar14 = uVar26 - iVar19;
                if (0xffe < (int)(uVar26 - iVar19)) {
                  iVar14 = 0xfff;
                }
                puVar21 = argb + uVar49;
                iVar16 = 0;
                iVar15 = 0;
                if (*puVar21 == puVar21[-1]) {
                  iVar15 = (*VP8LVectorMismatch)(puVar21,argb + (uVar49 - 1),iVar14);
                }
                if ((width <= iVar19) && (*puVar21 == puVar21[local_1e8])) {
                  iVar16 = (*VP8LVectorMismatch)(puVar21,puVar21 + local_1e8,iVar14);
                }
                if ((iVar15 < 4) || (iVar15 < iVar16)) {
                  if (iVar16 < 4) {
                    v = (PixOrCopy)((ulong)*puVar21 << 0x20 | 0x10000);
                    iVar16 = 1;
                  }
                  else {
                    v = (PixOrCopy)(local_1a8 + (ulong)(uint)(iVar16 << 0x10) + 2);
                  }
                }
                else {
                  v = (PixOrCopy)((ulong)(uint)(iVar15 << 0x10) | 0x100000002);
                  iVar16 = iVar15;
                }
                VP8LBackwardRefsCursorAdd(refs_00,v);
                uVar49 = (ulong)(uint)(iVar19 + iVar16);
              } while (iVar19 + iVar16 < (int)uVar26);
            }
            uVar18 = (uint)(refs_00->error_ == 0);
          }
          if (uVar18 == 0) goto LAB_0014000a;
          uVar54 = 0;
          uVar57 = 0;
          lVar47 = 1;
          do {
            uVar18 = cache_bits_max;
            if (lVar47 == 1) {
              uVar18 = 0;
            }
            if (lVar47 != 1 || do_no_cache != 0) {
              if (lVar47 == 0) {
                local_68[8] = 0;
                local_68[9] = 0;
                local_68[10] = 0;
                local_68[4] = 0;
                local_68[5] = 0;
                local_68[6] = 0;
                local_68[7] = 0;
                local_68[0] = 0;
                local_68[1] = 0;
                local_68[2] = 0;
                local_68[3] = 0;
                pPVar37 = *ppPVar27;
                if (pPVar37 == (PixOrCopyBlock *)0x0) {
                  pPVar51 = (PixOrCopy *)0x0;
                  local_278 = (PixOrCopy *)0x0;
                }
                else {
                  pPVar51 = pPVar37->start_;
                  local_278 = pPVar51 + pPVar37->size_;
                }
                local_e8[8] = (long *)0x0;
                local_e8[9] = (long *)0x0;
                local_e8[6] = (long *)0x0;
                local_e8[7] = (long *)0x0;
                local_e8[4] = (long *)0x0;
                local_e8[5] = (long *)0x0;
                local_e8[2] = (long *)0x0;
                local_e8[3] = (long *)0x0;
                local_e8[0] = (long *)0x0;
                local_e8[1] = (long *)0x0;
                local_e8[10] = (long *)0x0;
                if (uVar52 == 0) {
                  uVar18 = 0;
                }
                else {
                  puVar32 = argb;
                  if (-1 < (int)uVar52) {
                    pVVar36 = (VP8LColorCache *)local_198;
                    uVar49 = 0;
                    do {
                      iVar14 = (int)uVar49;
                      pVVar24 = VP8LAllocateHistogram(iVar14);
                      local_e8[uVar49] = (long *)pVVar24;
                      bVar53 = true;
                      if (pVVar24 == (VP8LHistogram *)0x0) goto LAB_0013fbc6;
                      VP8LHistogramInit(pVVar24,iVar14,1);
                      if (uVar49 != 0) {
                        iVar14 = VP8LColorCacheInit(pVVar36,iVar14);
                        local_68[uVar49] = iVar14;
                        if (iVar14 == 0) goto LAB_0013fbc6;
                      }
                      uVar49 = uVar49 + 1;
                      pVVar36 = pVVar36 + 1;
                    } while (uVar20 != uVar49);
                  }
                  while (pPVar51 != (PixOrCopy *)0x0) {
                    if (pPVar51->mode == '\0') {
                      uVar40 = *puVar32;
                      puVar32 = puVar32 + 1;
                      pVVar44 = (VP8LBackwardRefs *)(ulong)(uVar40 >> 8 & 0xff);
                      piVar48 = (int *)((long)local_e8[0] + (ulong)(uVar40 & 0xff) * 4 + 0x408);
                      *piVar48 = *piVar48 + 1;
                      piVar48 = (int *)(*local_e8[0] + (long)pVVar44 * 4);
                      *piVar48 = *piVar48 + 1;
                      uVar49 = (ulong)(uVar40 >> 0x10 & 0xff);
                      piVar48 = (int *)((long)local_e8[0] + uVar49 * 4 + 8);
                      *piVar48 = *piVar48 + 1;
                      piVar48 = (int *)((long)local_e8[0] + (ulong)(uVar40 >> 0x18) * 4 + 0x808);
                      *piVar48 = *piVar48 + 1;
                      if (0 < (int)uVar52) {
                        uVar43 = uVar40 * 0x1e35a7bd >> ((byte)local_238[3] & 0x1f);
                        plVar28 = local_1e0;
                        pVVar34 = pVVar1;
                        do {
                          if (*(uint *)(*plVar28 + (ulong)uVar43 * 4) == uVar40) {
                            piVar48 = (int *)(*local_e8[(long)((long)&pVVar34[-1].last_block_ + 7)]
                                              + (long)(int)uVar43 * 4 + 0x460);
                          }
                          else {
                            *(uint *)(*plVar28 + (ulong)uVar43 * 4) = uVar40;
                            plVar8 = local_e8[(long)((long)&pVVar34[-1].last_block_ + 7)];
                            piVar48 = (int *)((long)plVar8 + (ulong)(uVar40 & 0xff) * 4 + 0x408);
                            *piVar48 = *piVar48 + 1;
                            piVar48 = (int *)(*plVar8 + (long)pVVar44 * 4);
                            *piVar48 = *piVar48 + 1;
                            piVar48 = (int *)((long)plVar8 + uVar49 * 4 + 8);
                            *piVar48 = *piVar48 + 1;
                            piVar48 = (int *)((long)plVar8 + (ulong)(uVar40 >> 0x18) * 4 + 0x808);
                          }
                          *piVar48 = *piVar48 + 1;
                          uVar43 = (int)uVar43 >> 1;
                          pVVar34 = (VP8LBackwardRefs *)((long)&pVVar34[-1].last_block_ + 7);
                          plVar28 = plVar28 + -2;
                        } while (1 < (long)pVVar34);
                      }
                    }
                    else {
                      uVar3 = pPVar51->len;
                      uVar40 = (uint)uVar3;
                      if (uVar3 < 0x200) {
                        uVar43 = (uint)kPrefixEncodeCode[(uint)uVar3].code_;
                      }
                      else {
                        uVar45 = uVar3 - 1;
                        uVar43 = 0x1f;
                        if (uVar45 != 0) {
                          for (; uVar45 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                          }
                        }
                        bVar53 = (uVar45 >> ((byte)(0x1e - (char)(uVar43 ^ 0x1f)) & 0x1f) & 1) != 0;
                        pVVar44 = (VP8LBackwardRefs *)(ulong)bVar53;
                        uVar43 = (uint)bVar53 + (uVar43 ^ 0x1f) * 2 ^ 0x3e;
                      }
                      uVar45 = *puVar32;
                      if (-1 < (int)uVar52) {
                        uVar49 = 0;
                        do {
                          pVVar44 = (VP8LBackwardRefs *)*local_e8[uVar49];
                          piVar48 = (int *)((long)&pVVar44[0x19].free_blocks_ +
                                           (long)(int)uVar43 * 4);
                          *piVar48 = *piVar48 + 1;
                          uVar49 = uVar49 + 1;
                        } while (uVar20 != uVar49);
                      }
                      uVar43 = ~uVar45;
                      do {
                        uVar45 = *puVar32;
                        if ((0 < (int)uVar52) && (uVar45 != uVar43)) {
                          uVar43 = uVar45 * 0x1e35a7bd >> ((byte)local_238[3] & 0x1f);
                          plVar28 = local_1e0;
                          pVVar44 = pVVar1;
                          do {
                            *(uint *)(*plVar28 + (long)(int)uVar43 * 4) = uVar45;
                            uVar43 = (int)uVar43 >> 1;
                            pVVar44 = (VP8LBackwardRefs *)((long)&pVVar44[-1].last_block_ + 7);
                            plVar28 = plVar28 + -2;
                          } while (1 < (long)pVVar44);
                        }
                        puVar32 = puVar32 + 1;
                        uVar40 = uVar40 - 1;
                        uVar43 = uVar45;
                      } while (uVar40 != 0);
                    }
                    pPVar51 = pPVar51 + 1;
                    if (pPVar51 == local_278) {
                      pPVar37 = pPVar37->next_;
                      if (pPVar37 == (PixOrCopyBlock *)0x0) break;
                      pPVar51 = pPVar37->start_;
                      local_278 = pPVar51 + pPVar37->size_;
                    }
                  }
                  if (-1 < (int)uVar52) {
                    uVar35 = 0;
                    uVar49 = (ulong)uVar18;
                    uVar55 = 0x40000000;
                    uVar58 = 0x46293e59;
                    do {
                      dVar10 = VP8LHistogramEstimateBits((VP8LHistogram *)local_e8[uVar35]);
                      bVar53 = (double)CONCAT44(uVar58,uVar55) <= dVar10;
                      uVar41 = uVar35 & 0xffffffff;
                      if (bVar53 && uVar35 != 0) {
                        uVar41 = uVar49;
                      }
                      uVar18 = (uint)uVar41;
                      uVar56 = SUB84(dVar10,0);
                      uVar59 = (int)((ulong)dVar10 >> 0x20);
                      if (bVar53 && uVar35 != 0) {
                        uVar56 = uVar55;
                        uVar59 = uVar58;
                      }
                      uVar35 = uVar35 + 1;
                      uVar49 = uVar41;
                      uVar55 = uVar56;
                      uVar58 = uVar59;
                    } while (uVar20 != uVar35);
                    bVar53 = false;
LAB_0013fbc6:
                    if (-1 < (int)uVar52) {
                      pVVar36 = (VP8LColorCache *)local_198;
                      uVar49 = 0;
                      do {
                        if (local_68[uVar49] != 0) {
                          VP8LColorCacheClear(pVVar36);
                        }
                        VP8LFreeHistogram((VP8LHistogram *)local_e8[uVar49]);
                        uVar49 = uVar49 + 1;
                        pVVar36 = pVVar36 + 1;
                      } while (uVar20 != uVar49);
                    }
                    if (bVar53) goto LAB_0014000a;
                  }
                }
                if (0 < (int)uVar18) {
                  pPVar37 = *ppPVar27;
                  if (pPVar37 == (PixOrCopyBlock *)0x0) {
                    iVar14 = VP8LColorCacheInit((VP8LColorCache *)local_198,uVar18);
                    if (iVar14 == 0) goto LAB_0014000a;
                  }
                  else {
                    pPVar51 = pPVar37->start_;
                    iVar14 = pPVar37->size_;
                    iVar19 = VP8LColorCacheInit((VP8LColorCache *)local_198,uVar18);
                    if (iVar19 == 0) goto LAB_0014000a;
                    if (pPVar51 != (PixOrCopy *)0x0) {
                      pPVar33 = pPVar51 + iVar14;
                      iVar14 = 0;
                      do {
                        if (pPVar51->mode == '\0') {
                          uVar4 = pPVar51->argb_or_distance;
                          uVar43 = uVar4 * 0x1e35a7bd >> ((byte)pPStack_190 & 0x1f);
                          uVar40 = 0xffffffff;
                          if (*(uint32_t *)((long)local_198 + (long)(int)uVar43 * 4) == uVar4) {
                            uVar40 = uVar43;
                          }
                          if ((int)uVar40 < 0) {
                            *(uint32_t *)((long)local_198 + (long)(int)uVar43 * 4) = uVar4;
                          }
                          else {
                            *pPVar51 = (PixOrCopy)((ulong)uVar40 << 0x20 | 0x10001);
                          }
                          iVar14 = iVar14 + 1;
                        }
                        else {
                          uVar3 = pPVar51->len;
                          if (uVar3 != 0) {
                            pVVar44 = (VP8LBackwardRefs *)(argb + iVar14);
                            lVar50 = 0;
                            do {
                              *(int *)((long)local_198 +
                                      (long)(int)((uint)((&pVVar44->block_size_)[lVar50] *
                                                        0x1e35a7bd) >> ((byte)pPStack_190 & 0x1f)) *
                                      4) = (&pVVar44->block_size_)[lVar50];
                              lVar50 = lVar50 + 1;
                            } while ((uint)uVar3 != (uint)lVar50);
                            iVar14 = iVar14 + (uint)lVar50;
                          }
                        }
                        pPVar51 = pPVar51 + 1;
                        if (pPVar51 == pPVar33) {
                          pPVar37 = pPVar37->next_;
                          if (pPVar37 == (PixOrCopyBlock *)0x0) break;
                          pPVar51 = pPVar37->start_;
                          pPVar33 = pPVar51 + pPVar37->size_;
                        }
                      } while (pPVar51 != (PixOrCopy *)0x0);
                    }
                  }
                  VP8LColorCacheClear((VP8LColorCache *)local_198);
                }
                if ((do_no_cache == 0) || (uVar40 = 0, uVar18 != 0)) goto LAB_0013f6d7;
              }
              else {
LAB_0013f6d7:
                uVar40 = uVar18;
                pVVar24 = local_210;
                VP8LHistogramCreate(local_210,refs_00,uVar40);
                dVar10 = VP8LHistogramEstimateBits(pVVar24);
                uVar54 = SUB84(dVar10,0);
                uVar57 = (undefined4)((ulong)dVar10 >> 0x20);
              }
              if ((double)CONCAT44(uVar57,uVar54) <= local_1d8[lVar47] &&
                  local_1d8[lVar47] != (double)CONCAT44(uVar57,uVar54)) {
                if (lVar47 == 1) {
                  iVar14 = BackwardRefsClone((VP8LBackwardRefs *)*ppPVar27,local_1a0);
                  if (iVar14 == 0) goto LAB_0014000a;
                  local_238[1] = uVar38;
                  local_1d8[1] = (double)CONCAT44(uVar57,uVar54);
                }
                else {
                  ppPVar6 = refs_00->tail_;
                  ppPVar7 = refs->tail_;
                  local_178 = refs_00->last_block_;
                  local_198 = *(undefined1 (*) [8])refs_00;
                  pPStack_190 = refs_00->refs_;
                  local_188 = refs_00->tail_;
                  uStack_180 = refs_00->free_blocks_;
                  ppPVar12 = local_188;
                  pPVar13 = uStack_180;
                  refs_00->last_block_ = refs->last_block_;
                  iVar14 = refs->block_size_;
                  iVar19 = refs->error_;
                  pPVar37 = refs->refs_;
                  pPVar11 = refs->free_blocks_;
                  refs_00->tail_ = refs->tail_;
                  refs_00->free_blocks_ = pPVar11;
                  refs_00->block_size_ = iVar14;
                  refs_00->error_ = iVar19;
                  refs_00->refs_ = pPVar37;
                  refs->last_block_ = local_178;
                  local_188._4_4_ = (undefined4)((ulong)local_188 >> 0x20);
                  uStack_180._4_4_ = (undefined4)((ulong)uStack_180 >> 0x20);
                  *(undefined4 *)&refs->tail_ = (undefined4)local_188;
                  *(undefined4 *)((long)&refs->tail_ + 4) = local_188._4_4_;
                  *(undefined4 *)&refs->free_blocks_ = (undefined4)uStack_180;
                  *(undefined4 *)((long)&refs->free_blocks_ + 4) = uStack_180._4_4_;
                  *(undefined1 (*) [8])refs = local_198;
                  refs->refs_ = pPStack_190;
                  if (ppPVar7 == local_1f0 && ppPVar7 != (PixOrCopyBlock **)0x0) {
                    refs_00->tail_ = ppPVar27;
                  }
                  if (ppPVar6 != (PixOrCopyBlock **)0x0 && ppPVar6 == ppPVar27) {
                    refs->tail_ = local_1f0;
                  }
                  local_188 = ppPVar12;
                  uStack_180 = pPVar13;
                  local_1d8[lVar47] = (double)CONCAT44(uVar57,uVar54);
                  local_238[lVar47] = uVar38;
                  pVVar44 = refs_00;
                  if (lVar47 == 0) {
                    *cache_bits_best = uVar40;
                    break;
                  }
                }
              }
            }
            bVar53 = lVar47 != 0;
            lVar47 = lVar47 + -1;
          } while (bVar53);
        }
        uVar18 = ~uVar38;
        uVar38 = uVar38 * 2;
        lz77_types_to_try = local_204 & uVar18;
      } while (lz77_types_to_try != 0);
      local_240 = SUB84(local_238._0_8_,4);
      uVar52 = local_238[0];
    }
    lVar50 = 2;
    lVar47 = 0;
    do {
      if (do_no_cache != 0 || lVar47 != 0) {
        iVar14 = *(int *)((long)local_238 + lVar50 * 2);
        if (iVar14 == 1) {
          hash_chain_00 = hash_chain;
          if (0x18 < quality) {
LAB_0013fe37:
            if (lVar47 == 0) {
              iVar14 = 0;
            }
            else {
              iVar14 = *cache_bits_best;
            }
            pVVar44 = (VP8LBackwardRefs *)((long)&refs[1].block_size_ + lVar47);
            iVar19 = VP8LBackwardReferencesTraceBackwards
                               (width,height,argb,iVar14,hash_chain_00,pVVar44,refs_00);
            pVVar24 = local_210;
            if (iVar19 != 0) {
              VP8LHistogramCreate(local_210,refs_00,iVar14);
              dVar10 = VP8LHistogramEstimateBits(pVVar24);
              if (dVar10 < *(double *)((long)local_1d8 + lVar50 * 4)) {
                ppPVar27 = refs_00->tail_;
                lVar25 = (long)&refs[1].refs_ + lVar47;
                lVar9 = *(long *)((long)&refs[1].tail_ + lVar47);
                local_178 = refs_00->last_block_;
                local_198 = *(undefined1 (*) [8])refs_00;
                pPStack_190 = refs_00->refs_;
                local_188 = refs_00->tail_;
                uStack_180 = refs_00->free_blocks_;
                refs_00->last_block_ = *(PixOrCopyBlock **)((long)&refs[1].last_block_ + lVar47);
                iVar14 = pVVar44->block_size_;
                iVar19 = pVVar44->error_;
                pPVar37 = *(PixOrCopyBlock **)((long)&refs[1].refs_ + lVar47);
                pPVar11 = *(PixOrCopyBlock **)((long)&refs[1].free_blocks_ + lVar47);
                refs_00->tail_ = *(PixOrCopyBlock ***)((long)&refs[1].tail_ + lVar47);
                refs_00->free_blocks_ = pPVar11;
                refs_00->block_size_ = iVar14;
                refs_00->error_ = iVar19;
                refs_00->refs_ = pPVar37;
                *(PixOrCopyBlock **)((long)&refs[1].last_block_ + lVar47) = local_178;
                *(PixOrCopyBlock ***)((long)&refs[1].tail_ + lVar47) = local_188;
                *(PixOrCopyBlock **)((long)&refs[1].free_blocks_ + lVar47) = uStack_180;
                *(undefined1 (*) [8])pVVar44 = local_198;
                *(PixOrCopyBlock **)((long)&refs[1].refs_ + lVar47) = pPStack_190;
                if (lVar25 == lVar9 && lVar9 != 0) {
                  refs_00->tail_ = &refs_00->refs_;
                }
                if (ppPVar27 != (PixOrCopyBlock **)0x0 && ppPVar27 == &refs_00->refs_) {
                  *(long *)((long)&refs[1].tail_ + lVar47) = lVar25;
                }
              }
            }
          }
        }
        else if ((0x18 < quality) && (hash_chain_00 = &local_228, iVar14 == 4)) goto LAB_0013fe37;
        BackwardReferences2DLocality(width,*(VP8LBackwardRefs **)((long)&refs[1].refs_ + lVar47));
        if (((lVar47 == 0) && (uVar52 == local_240)) && (*cache_bits_best == 0)) {
          iVar14 = BackwardRefsClone((VP8LBackwardRefs *)refs[1].refs_,refs);
          if (iVar14 == 0) goto LAB_0014000a;
          break;
        }
      }
      lVar50 = lVar50 + -2;
      lVar47 = lVar47 + -0x28;
    } while (lVar47 != -0x50);
    WebPSafeFree(local_228.offset_length_);
    local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
    local_228.offset_length_ = (uint32_t *)0x0;
    VP8LFreeHistogram(local_210);
  }
  else {
    *cache_bits_best = 0;
    iVar14 = BackwardReferencesLz77(width,height,argb,(int)hash_chain,(VP8LHashChain *)refs,pVVar44)
    ;
    if (iVar14 == 0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    BackwardReferences2DLocality(width,(VP8LBackwardRefs *)refs->refs_);
  }
  return VP8_ENC_OK;
}

Assistant:

WebPEncodingError VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) return VP8_ENC_ERROR_OUT_OF_MEMORY;
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  return VP8_ENC_OK;
}